

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

void LZ4HC_init_internal(LZ4HC_CCtx_internal *hc4,BYTE *start)

{
  LZ4_u32 LVar1;
  ulong uVar2;
  
  uVar2 = (long)hc4->end - (long)hc4->base;
  if (0x40000000 < uVar2) {
    uVar2 = 0;
    memset(hc4,0,0x20000);
    memset(hc4->chainTable,0xff,0x20000);
  }
  LVar1 = (int)uVar2 + 0x10000;
  hc4->nextToUpdate = LVar1;
  hc4->base = start + (-0x10000 - uVar2);
  hc4->end = start;
  hc4->dictBase = start + (-0x10000 - uVar2);
  hc4->dictLimit = LVar1;
  hc4->lowLimit = LVar1;
  return;
}

Assistant:

static void LZ4HC_init_internal (LZ4HC_CCtx_internal* hc4, const BYTE* start)
{
    uptrval startingOffset = (uptrval)(hc4->end - hc4->base);
    if (startingOffset > 1 GB) {
        LZ4HC_clearTables(hc4);
        startingOffset = 0;
    }
    startingOffset += 64 KB;
    hc4->nextToUpdate = (U32) startingOffset;
    hc4->base = start - startingOffset;
    hc4->end = start;
    hc4->dictBase = start - startingOffset;
    hc4->dictLimit = (U32) startingOffset;
    hc4->lowLimit = (U32) startingOffset;
}